

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper_sse4.cpp
# Opt level: O0

void storeRGBx64FromRGBA64PM_sse4
               (uchar *dest,QRgba64 *src,int index,int count,QList<unsigned_int> *param_5,
               QDitherInfo *param_6)

{
  QRgba64 *d;
  int in_stack_0000014c;
  QRgba64 *in_stack_00000150;
  QRgba64 *in_stack_00000158;
  
  convertRGBA64FromRGBA64PM_sse4<true>(in_stack_00000158,in_stack_00000150,in_stack_0000014c);
  return;
}

Assistant:

void QT_FASTCALL storeRGBx64FromRGBA64PM_sse4(uchar *dest, const QRgba64 *src, int index, int count,
                                              const QList<QRgb> *, QDitherInfo *)
{
    QRgba64 *d = (QRgba64 *)dest + index;
    convertRGBA64FromRGBA64PM_sse4<true>(d, src, count);
}